

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O3

void elf_writesections(GlobalVars *gv,FILE *f)

{
  node *pnVar1;
  node *pnVar2;
  node *pnVar3;
  
  pnVar3 = (gv->lnksec).first;
  pnVar1 = pnVar3->next;
  if (pnVar1 != (node *)0x0) {
    do {
      pnVar2 = pnVar1;
      if (((ulong)pnVar3[2].next & 0x300) == 0x100) {
        fwritex(f,pnVar3[8].next,(size_t)pnVar3[5].next);
        pnVar2 = pnVar3->next;
      }
      pnVar1 = pnVar2->next;
      pnVar3 = pnVar2;
    } while (pnVar1 != (node *)0x0);
    pnVar3 = (gv->lnksec).first;
    pnVar1 = pnVar3->next;
    while (pnVar1 != (node *)0x0) {
      pnVar2 = pnVar1;
      if (((ulong)pnVar3[2].next & 0x300) == 0) {
        fwritex(f,pnVar3[8].next,(size_t)pnVar3[5].next);
        pnVar2 = pnVar3->next;
      }
      pnVar3 = pnVar2;
      pnVar1 = pnVar2->next;
    }
  }
  return;
}

Assistant:

void elf_writesections(struct GlobalVars *gv,FILE *f)
/* write all linked sections */
{
  struct LinkedSection *ls;

  /* write all allocated sections */
  for (ls=(struct LinkedSection *)gv->lnksec.first;
       ls->n.next!=NULL; ls=(struct LinkedSection *)ls->n.next) {
    if (ls->flags & SF_ALLOC) {
      if (!(ls->flags & SF_UNINITIALIZED))
        fwritex(f,ls->data,ls->size);
    }
  }
  /* unallocated sections at last */
  for (ls=(struct LinkedSection *)gv->lnksec.first;
       ls->n.next!=NULL; ls=(struct LinkedSection *)ls->n.next) {
    if (!(ls->flags & SF_ALLOC)) {
      if (!(ls->flags & SF_UNINITIALIZED))
        fwritex(f,ls->data,ls->size);
    }
  }
}